

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjPlaneWidth(int componentID,int width,int subsamp)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  if (((width < 1 || 5 < (uint)subsamp) || (componentID < 0)) ||
     ((uint)(subsamp != 3) * 2 + 1 <= (uint)componentID)) {
    pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar3,"tjPlaneWidth(): Invalid argument",0x21);
    uVar2 = 0xffffffff;
  }
  else {
    iVar1 = tjMCUWidth[(uint)subsamp] / 8;
    uVar2 = -iVar1 & (width + iVar1) - 1U;
    if (componentID != 0) {
      uVar2 = (int)(uVar2 << 3) / tjMCUWidth[(uint)subsamp];
    }
  }
  return uVar2;
}

Assistant:

DLLEXPORT int tjPlaneWidth(int componentID, int width, int subsamp)
{
  int pw, nc, retval = 0;

  if (width < 1 || subsamp < 0 || subsamp >= TJ_NUMSAMP)
    THROWG("tjPlaneWidth(): Invalid argument");
  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  if (componentID < 0 || componentID >= nc)
    THROWG("tjPlaneWidth(): Invalid argument");

  pw = PAD(width, tjMCUWidth[subsamp] / 8);
  if (componentID == 0)
    retval = pw;
  else
    retval = pw * 8 / tjMCUWidth[subsamp];

bailout:
  return retval;
}